

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O3

void expand_sha1(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                uint32_t len)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  uint8_t *data;
  uint8_t *data_00;
  ulong __n;
  uint8_t *puVar4;
  uint32_t uVar5;
  undefined4 in_register_0000008c;
  uint8_t uVar6;
  uint32_t uVar7;
  ulong __n_00;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *dst;
  undefined8 uStack_80;
  ulong local_78;
  ulong local_70;
  undefined8 local_68;
  uint8_t *local_60;
  ulong local_58;
  undefined8 local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint32_t local_38;
  uint local_34;
  
  local_50 = CONCAT44(in_register_0000008c,len);
  __n_00 = (ulong)infolen;
  __n = (ulong)(infolen + 0x15);
  uVar9 = __n + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar9;
  dst = (uint8_t *)((long)&local_78 + lVar1);
  local_60 = okm;
  local_58 = __n;
  local_48 = prk;
  local_40 = info;
  local_38 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176532;
  memset(dst,0,__n);
  puVar4 = local_40;
  uVar3 = local_50;
  data_00 = (uint8_t *)((long)&local_68 + (4 - uVar9));
  local_40 = (uint8_t *)__n_00;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176553;
  memcpy(data_00,puVar4,__n_00);
  uVar8 = (uint)uVar3;
  if (uVar8 < 0x14) {
    local_34 = (len / 0x14) * 0x14;
    if (uVar8 <= local_34) {
      return;
    }
    data_00[(long)local_40] = (char)((ulong)len / 0x14) + '\x01';
  }
  else {
    local_34 = infolen + 1;
    local_68 = (ulong)((len / 0x14) * 4);
    lVar2 = local_68 * 5;
    uVar6 = '\x01';
    lVar10 = 0;
    local_78 = __n_00;
    local_70 = (ulong)len / 0x14;
    do {
      data_00[(long)local_40] = uVar6;
      uVar7 = local_38;
      puVar4 = local_48;
      data = data_00;
      uVar5 = local_34;
      if (lVar10 != 0) {
        data = dst;
        uVar5 = (uint32_t)local_58;
      }
      *(undefined8 *)((long)&uStack_80 + lVar1) = 0x1765d8;
      EverCrypt_HMAC_compute_sha1(dst,puVar4,uVar7,data,uVar5);
      *(undefined4 *)(local_60 + lVar10 + 0x10) = *(undefined4 *)((long)&local_68 + lVar1);
      uVar3 = *(undefined8 *)((long)&local_70 + lVar1);
      *(undefined8 *)(local_60 + lVar10) = *(undefined8 *)dst;
      *(undefined8 *)(local_60 + lVar10 + 8) = uVar3;
      lVar10 = lVar10 + 0x14;
      uVar6 = uVar6 + '\x01';
    } while (lVar2 != lVar10);
    local_34 = (int)local_68 * 5;
    uVar8 = (uint)local_50;
    infolen = (uint32_t)local_78;
    if (uVar8 <= local_34) {
      return;
    }
    data_00[(long)local_40] = (char)local_70 + '\x01';
    if (0x13 < uVar8) {
      uVar7 = (uint32_t)local_58;
      data_00 = dst;
      goto LAB_0017664a;
    }
  }
  uVar7 = infolen + 1;
LAB_0017664a:
  uVar5 = local_38;
  puVar4 = local_48;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x17664f;
  EverCrypt_HMAC_compute_sha1(dst,puVar4,uVar5,data_00,uVar7);
  puVar4 = local_60 + local_34;
  uVar8 = uVar8 - local_34;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176669;
  memcpy(puVar4,dst,(ulong)uVar8);
  return;
}

Assistant:

static void
expand_sha1(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 20U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}